

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCDPP_MPI.h
# Opt level: O0

void __thiscall CCDPP_MPI::~CCDPP_MPI(CCDPP_MPI *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  *in_stack_ffffffffffffffd0;
  vector<Rating,_std::allocator<Rating>_> *this_00;
  
  pvVar1 = (void *)*in_RDI;
  if (pvVar1 != (void *)0x0) {
    boost::threadpool::
    thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
    ::~thread_pool(in_stack_ffffffffffffffd0);
    operator_delete(pvVar1);
  }
  this_00 = (vector<Rating,_std::allocator<Rating>_> *)in_RDI[8];
  if (this_00 != (vector<Rating,_std::allocator<Rating>_> *)0x0) {
    operator_delete__(this_00);
  }
  if ((void *)in_RDI[9] != (void *)0x0) {
    operator_delete__((void *)in_RDI[9]);
  }
  if ((*(byte *)(in_RDI[7] + 0x69) & 1) != 0) {
    if ((void *)in_RDI[0x1e] != (void *)0x0) {
      operator_delete__((void *)in_RDI[0x1e]);
    }
    if ((void *)in_RDI[0x1f] != (void *)0x0) {
      operator_delete__((void *)in_RDI[0x1f]);
    }
  }
  MPI_Finalize();
  std::vector<Rating,_std::allocator<Rating>_>::~vector(this_00);
  std::vector<Rating,_std::allocator<Rating>_>::~vector(this_00);
  std::
  unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
  ::~unordered_map((unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                    *)0x1746cc);
  std::
  unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
  ::~unordered_map((unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                    *)0x1746da);
  return;
}

Assistant:

~CCDPP_MPI(){

        delete thread_pool;
        delete[] Q;
        delete[] P;

        if(parameter->verbose){
            delete[] entire_Q;
            delete[] entire_P;
        }

        MPI_Finalize();
    }